

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  pointer pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string dot_extension;
  string local_80;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_40,extension);
  local_80._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar4) {
    local_80.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_80._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar2 = String::EndsWithCaseInsensitive(&this->pathname_,&local_80);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)this);
    paVar4 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar4;
    if (local_60._M_p == &local_50) {
      paVar4->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
      *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_48;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = local_60._M_p;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity =
           CONCAT71(uStack_4f,local_50);
    }
    (__return_storage_ptr__->pathname_)._M_string_length = local_58;
    local_58 = 0;
    local_50 = '\0';
    local_60._M_p = &local_50;
    Normalize(__return_storage_ptr__);
    if (local_60._M_p != &local_50) {
      operator_delete(local_60._M_p,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->pathname_)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(
        pathname_.substr(0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}